

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O0

void __thiscall wmj::fileWatcher::fileWatcher::run(fileWatcher *this)

{
  bool bVar1;
  fileWatcher *this_local;
  
  while ((this->need_watching & 1U) != 0) {
    bVar1 = watchOnce(this);
    if (bVar1) {
      std::function<void_()>::operator()(&this->call_back_func);
    }
  }
  return;
}

Assistant:

void fileWatcher::run() {
    while(need_watching) {
        if(watchOnce()) {
            this->call_back_func();
        }
    }
}